

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter_server_test.cc
# Opt level: O0

void __thiscall xLearn::KVStoreTest_FeatMap_Test::TestBody(KVStoreTest_FeatMap_Test *this)

{
  bool bVar1;
  index_t iVar2;
  char *pcVar3;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  KVStore store;
  uint *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  char *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffdbc;
  AssertHelper local_1b8;
  Message local_1b0;
  undefined4 local_1a8;
  index_t local_1a4;
  AssertionResult local_1a0;
  AssertHelper local_190;
  undefined4 in_stack_fffffffffffffe78;
  index_t in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe84;
  index_t iVar6;
  AssertionResult local_178;
  AssertHelper local_168;
  Message local_160;
  undefined4 local_158;
  index_t local_154;
  AssertionResult local_150;
  AssertHelper local_140;
  Message local_138;
  undefined4 local_130;
  index_t local_12c;
  AssertionResult local_128;
  AssertHelper local_118;
  Message local_110;
  undefined4 local_108;
  index_t local_104;
  AssertionResult local_100;
  AssertHelper local_f0;
  Message local_e8;
  undefined4 local_e0;
  index_t local_dc;
  AssertionResult local_d8;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b8;
  index_t local_b4;
  AssertionResult local_b0;
  AssertHelper local_a0;
  Message local_98;
  undefined4 local_90;
  index_t local_8c;
  AssertionResult local_88;
  AssertHelper local_78;
  Message local_70;
  undefined4 local_68;
  index_t local_64;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48;
  undefined4 local_40;
  index_t local_3c;
  AssertionResult local_38 [2];
  KVStore local_18;
  
  KVStore::KVStore(&local_18);
  KVStore::Initialize((KVStore *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                      CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  local_3c = KVStore::FeatMap((KVStore *)
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                              in_stack_fffffffffffffe7c);
  local_40 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
             in_stack_fffffffffffffdb0,
             (uint *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             in_stack_fffffffffffffda0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_38);
  if (!bVar1) {
    testing::Message::Message(&local_48);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1386fc);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x2d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_50,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x13875f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1387b7);
  local_64 = KVStore::FeatMap((KVStore *)
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                              in_stack_fffffffffffffe7c);
  local_68 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
             in_stack_fffffffffffffdb0,
             (uint *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             in_stack_fffffffffffffda0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x138887);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x2e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message((Message *)0x1388ea);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x138942);
  local_8c = KVStore::FeatMap((KVStore *)
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                              in_stack_fffffffffffffe7c);
  local_90 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
             in_stack_fffffffffffffdb0,
             (uint *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             in_stack_fffffffffffffda0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x138a12);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x2f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message((Message *)0x138a6f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x138ac7);
  local_b4 = KVStore::FeatMap((KVStore *)
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                              in_stack_fffffffffffffe7c);
  local_b8 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
             in_stack_fffffffffffffdb0,
             (uint *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             in_stack_fffffffffffffda0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x138b8b);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x30,pcVar3);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x138be8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x138c40);
  local_dc = KVStore::FeatMap((KVStore *)
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                              in_stack_fffffffffffffe7c);
  local_e0 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
             in_stack_fffffffffffffdb0,
             (uint *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             in_stack_fffffffffffffda0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x138d04);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x31,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message((Message *)0x138d61);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x138db9);
  local_104 = KVStore::FeatMap((KVStore *)
                               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                               in_stack_fffffffffffffe7c);
  local_108 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
             in_stack_fffffffffffffdb0,
             (uint *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             in_stack_fffffffffffffda0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x138e7d);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x32,pcVar3);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::Message::~Message((Message *)0x138eda);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x138f32);
  local_12c = KVStore::FeatMap((KVStore *)
                               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                               in_stack_fffffffffffffe7c);
  local_130 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
             in_stack_fffffffffffffdb0,
             (uint *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             in_stack_fffffffffffffda0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x138ff6);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x33,pcVar3);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message((Message *)0x139053);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1390ab);
  local_154 = KVStore::FeatMap((KVStore *)
                               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                               in_stack_fffffffffffffe7c);
  local_158 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
             in_stack_fffffffffffffdb0,
             (uint *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             in_stack_fffffffffffffda0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_150);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x13916f);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x34,pcVar3);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message((Message *)0x1391cc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x139224);
  iVar2 = KVStore::FeatMap((KVStore *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                           in_stack_fffffffffffffe7c);
  uVar5 = 2;
  iVar6 = iVar2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT44(iVar2,in_stack_fffffffffffffdb8),in_stack_fffffffffffffdb0,
             (uint *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             in_stack_fffffffffffffda0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
  uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdb8);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xfffffffffffffe78);
    in_stack_fffffffffffffdb0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1392e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x35,in_stack_fffffffffffffdb0);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&stack0xfffffffffffffe78);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    testing::Message::~Message((Message *)0x139345);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13939d);
  local_1a4 = KVStore::FeatMap((KVStore *)CONCAT44(iVar6,uVar5),in_stack_fffffffffffffe7c);
  local_1a8 = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT44(iVar2,uVar4),in_stack_fffffffffffffdb0,
             (uint *)CONCAT44(local_1a4,in_stack_fffffffffffffda8),in_stack_fffffffffffffda0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x139461);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/distributed/parameter_server_test.cc"
               ,0x36,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    testing::Message::~Message((Message *)0x1394be);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x139513);
  KVStore::~KVStore(&local_18);
  return;
}

Assistant:

TEST(KVStoreTest, FeatMap) {
  KVStore store;
  store.Initialize(3);
  EXPECT_EQ(store.FeatMap((index_t)0), (index_t)0);
  EXPECT_EQ(store.FeatMap((index_t)1), (index_t)0);
  EXPECT_EQ(store.FeatMap((index_t)2), (index_t)0);
  EXPECT_EQ(store.FeatMap((index_t)3), (index_t)1);
  EXPECT_EQ(store.FeatMap((index_t)4), (index_t)1);
  EXPECT_EQ(store.FeatMap((index_t)5), (index_t)1);
  EXPECT_EQ(store.FeatMap((index_t)6), (index_t)2);
  EXPECT_EQ(store.FeatMap((index_t)7), (index_t)2);
  EXPECT_EQ(store.FeatMap((index_t)8), (index_t)2);
  EXPECT_EQ(store.FeatMap((index_t)9), (index_t)3);
}